

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O0

void dynet::TensorTools::identity(Tensor *val)

{
  uint uVar1;
  uint uVar2;
  runtime_error *prVar3;
  Dim *in_RDI;
  size_t j;
  size_t i;
  size_t pos;
  ulong local_30;
  ulong local_28;
  long local_20;
  
  if (in_RDI->nd == 2) {
    uVar1 = Dim::operator[](in_RDI,0);
    uVar2 = Dim::operator[](in_RDI,1);
    if (uVar1 == uVar2) {
      local_20 = 0;
      if (*(int *)(*(long *)(in_RDI[1].d + 3) + 0xc) == 0) {
        for (local_28 = 0; uVar1 = Dim::operator[](in_RDI,0), local_28 < uVar1;
            local_28 = local_28 + 1) {
          for (local_30 = 0; uVar1 = Dim::operator[](in_RDI,1), local_30 < uVar1;
              local_30 = local_30 + 1) {
            *(float *)(*(long *)(in_RDI[1].d + 1) + local_20 * 4) = (float)(local_28 == local_30);
            local_20 = local_20 + 1;
          }
        }
        return;
      }
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"Bad device type");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (prVar3,"Attempt to set a tensor that is not a square matrix to identity");
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void TensorTools::identity(Tensor& val) {
  if (val.d.nd != 2 || val.d[0] != val.d[1])
    throw std::runtime_error("Attempt to set a tensor that is not a square matrix to identity");
  size_t pos = 0;
  if (val.device->type == DeviceType::CPU) {
    for (size_t i = 0; i < val.d[0]; ++i)
      for (size_t j = 0; j < val.d[1]; ++j)
        val.v[pos++] = (i == j ? 1 : 0);
#if HAVE_CUDA
  } else if (val.device->type == DeviceType::GPU) {
    float* t = new float[val.d.size()];
    for (size_t i = 0; i < val.d[0]; ++i)
      for (size_t j = 0; j < val.d[1]; ++j)
        t[pos++] = (i == j ? 1 : 0);
    CUDA_CHECK(cudaMemcpy(val.v, t, sizeof(real) * val.d.size(), cudaMemcpyHostToDevice));
    delete[] t;
#endif
  } else { throw std::runtime_error("Bad device type"); }
}